

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O3

void __thiscall NeuralNetwork::gradientDescent(NeuralNetwork *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  pointer pLVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Index index_2;
  long lVar16;
  char *pcVar17;
  Index index_1;
  ulong uVar18;
  Index index;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  
  if (1 < this->layerCount_) {
    lVar16 = 0;
    do {
      pLVar7 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = *(Index *)((long)&pLVar7[lVar16].biasGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                 m_storage + 8);
      if ((long)uVar18 < 0) goto LAB_00105a56;
      if (*(Index *)((long)&pLVar7[lVar16].bias.
                            super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                    + 8) != uVar18) goto LAB_00105a6d;
      fVar6 = this->learningRate_;
      lVar8 = (long)pLVar7[lVar16].biasGrads.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar9 = (long)pLVar7[lVar16].bias.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar19 = uVar18 & 0x7ffffffffffffffc;
      if (3 < uVar18) {
        uVar21 = 0;
        do {
          pfVar1 = (float *)(lVar8 + uVar21 * 4);
          fVar10 = pfVar1[1];
          fVar11 = pfVar1[2];
          fVar12 = pfVar1[3];
          pfVar2 = (float *)(lVar9 + uVar21 * 4);
          fVar13 = pfVar2[1];
          fVar14 = pfVar2[2];
          fVar15 = pfVar2[3];
          pfVar3 = (float *)(lVar9 + uVar21 * 4);
          *pfVar3 = *pfVar2 - *pfVar1 * fVar6;
          pfVar3[1] = fVar13 - fVar10 * fVar6;
          pfVar3[2] = fVar14 - fVar11 * fVar6;
          pfVar3[3] = fVar15 - fVar12 * fVar6;
          uVar21 = uVar21 + 4;
        } while (uVar21 < uVar19);
      }
      for (; uVar19 != uVar18; uVar19 = uVar19 + 1) {
        *(float *)(lVar9 + uVar19 * 4) =
             *(float *)(lVar9 + uVar19 * 4) - *(float *)(lVar8 + uVar19 * 4) * fVar6;
      }
      uVar18 = *(Index *)((long)&pLVar7[lVar16].weightGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                 m_storage + 8);
      uVar19 = *(Index *)((long)&pLVar7[lVar16].weightGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                 m_storage + 0x10);
      if ((long)(uVar19 | uVar18) < 0) {
        pcVar17 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, -1>]"
        ;
        goto LAB_00105aa1;
      }
      if ((*(Index *)((long)&pLVar7[lVar16].weights.
                             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                             m_storage + 8) != uVar18) ||
         (*(Index *)((long)&pLVar7[lVar16].weights.
                            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                            m_storage + 0x10) != uVar19)) {
        pcVar17 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, -1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
        ;
        goto LAB_00105a82;
      }
      fVar6 = this->learningRate_;
      lVar8 = (long)pLVar7[lVar16].weightGrads.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
      ;
      lVar9 = (long)pLVar7[lVar16].weights.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
      ;
      uVar19 = uVar19 * uVar18;
      uVar18 = uVar19 + 3;
      if (-1 < (long)uVar19) {
        uVar18 = uVar19;
      }
      uVar18 = uVar18 & 0xfffffffffffffffc;
      if (3 < (long)uVar19) {
        lVar20 = 0;
        do {
          pfVar1 = (float *)(lVar8 + lVar20 * 4);
          fVar10 = pfVar1[1];
          fVar11 = pfVar1[2];
          fVar12 = pfVar1[3];
          pfVar2 = (float *)(lVar9 + lVar20 * 4);
          fVar13 = pfVar2[1];
          fVar14 = pfVar2[2];
          fVar15 = pfVar2[3];
          pfVar3 = (float *)(lVar9 + lVar20 * 4);
          *pfVar3 = *pfVar2 - *pfVar1 * fVar6;
          pfVar3[1] = fVar13 - fVar10 * fVar6;
          pfVar3[2] = fVar14 - fVar11 * fVar6;
          pfVar3[3] = fVar15 - fVar12 * fVar6;
          lVar20 = lVar20 + 4;
        } while (lVar20 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar19) {
        do {
          *(float *)(lVar9 + uVar18 * 4) =
               *(float *)(lVar9 + uVar18 * 4) - *(float *)(lVar8 + uVar18 * 4) * fVar6;
          uVar18 = uVar18 + 1;
        } while (uVar19 - uVar18 != 0);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (long)this->layerCount_ + -1);
  }
  pLVar7 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar18 = pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (-1 < (long)uVar18) {
    if (pLVar7[-1].bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows == uVar18) {
      fVar6 = this->learningRate_;
      pfVar1 = pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pfVar2 = pLVar7[-1].bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar19 = uVar18 & 0x7ffffffffffffffc;
      if (3 < uVar18) {
        uVar21 = 0;
        do {
          pfVar3 = pfVar1 + uVar21;
          fVar10 = pfVar3[1];
          fVar11 = pfVar3[2];
          fVar12 = pfVar3[3];
          pfVar4 = pfVar2 + uVar21;
          fVar13 = pfVar4[1];
          fVar14 = pfVar4[2];
          fVar15 = pfVar4[3];
          pfVar5 = pfVar2 + uVar21;
          *pfVar5 = *pfVar4 - *pfVar3 * fVar6;
          pfVar5[1] = fVar13 - fVar10 * fVar6;
          pfVar5[2] = fVar14 - fVar11 * fVar6;
          pfVar5[3] = fVar15 - fVar12 * fVar6;
          uVar21 = uVar21 + 4;
        } while (uVar21 < uVar19);
      }
      for (; uVar19 != uVar18; uVar19 = uVar19 + 1) {
        pfVar2[uVar19] = pfVar2[uVar19] - pfVar1[uVar19] * fVar6;
      }
      return;
    }
LAB_00105a6d:
    pcVar17 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
    ;
LAB_00105a82:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar17);
  }
LAB_00105a56:
  pcVar17 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
  ;
LAB_00105aa1:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar17);
}

Assistant:

void NeuralNetwork::gradientDescent() {
    using namespace std;
    //最后一层没有权重
    for (int i = 0; i < layerCount_ - 1; ++i) {
        auto& l = layers_[i];
        l.bias -= l.biasGrads * learningRate_;
        l.weights -= l.weightGrads * learningRate_;
    }
    this->layers_.back().bias -= this->layers_.back().biasGrads * learningRate_;
}